

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_ExponentiationExprPrecedence_Test::ExprWriterTest_ExponentiationExprPrecedence_Test
          (ExprWriterTest_ExponentiationExprPrecedence_Test *this)

{
  undefined8 *in_RDI;
  ExprWriterTest *in_stack_00000030;
  
  ExprWriterTest::ExprWriterTest(in_stack_00000030);
  *in_RDI = &PTR__ExprWriterTest_ExponentiationExprPrecedence_Test_001ed120;
  in_RDI[2] = &PTR__ExprWriterTest_ExponentiationExprPrecedence_Test_001ed160;
  return;
}

Assistant:

TEST_F(ExprWriterTest, ExponentiationExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1), x3 = MakeVariable(2);
  CHECK_WRITE("x1 ^ x2 ^ x3",
      MakeBinary(ex::POW, x1, MakeBinary(ex::POW, x2, x3)));
  CHECK_WRITE("x1 ^ x2 ^ 3",
      MakeBinary(ex::POW, x1, MakeBinary(ex::POW_CONST_BASE, x2,
                                         MakeConst(3))));
  CHECK_WRITE("x1 ^ 3 ^ x2",
      MakeBinary(ex::POW, x1, MakeBinary(ex::POW_CONST_EXP, MakeConst(3), x2)));
  CHECK_WRITE("(x1 ^ 2) ^ 3",
      MakeBinary(ex::POW_CONST_BASE, MakeBinary(ex::POW_CONST_BASE, x1,
                                                MakeConst(2)), MakeConst(3)));
  CHECK_WRITE("-x1 ^ -x2",
      MakeBinary(ex::POW, MakeUnary(ex::MINUS, x1), MakeUnary(ex::MINUS, x2)));
  CHECK_WRITE("x1 ^ (x2 * x3)",
      MakeBinary(ex::POW, x1, MakeBinary(ex::MUL, x2, x3)));
}